

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O1

string_view __thiscall
google::protobuf::Reflection::GetStringView
          (Reflection *this,Message *message,FieldDescriptor *field,ScratchSpace *scratch)

{
  byte bVar1;
  Nonnull<const_char_*> pcVar2;
  bool v1;
  char *description;
  Descriptor *pDVar3;
  Metadata MVar4;
  string_view sVar5;
  
  MVar4 = Message::GetMetadata(message);
  if (MVar4.reflection != this) {
    pDVar3 = this->descriptor_;
    MVar4 = Message::GetMetadata(message);
    anon_unknown_6::ReportReflectionUsageMessageError(pDVar3,MVar4.descriptor,field,"GetStringView")
    ;
  }
  pDVar3 = this->descriptor_;
  if (field->containing_type_ == pDVar3) {
    bVar1 = field->field_0x1;
    v1 = (bool)((bVar1 & 0x20) >> 5);
    if (0xbf < bVar1 == v1) {
      pcVar2 = (Nonnull<const_char_*>)0x0;
    }
    else {
      pcVar2 = absl::lts_20250127::log_internal::MakeCheckOpString<bool,bool>
                         (v1,0xbf < bVar1,
                          "is_repeated_ == static_cast<Label>(label_) == LABEL_REPEATED");
    }
    if (pcVar2 == (Nonnull<const_char_*>)0x0) {
      if ((field->field_0x1 & 0x20) == 0) {
        if (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)field->type_ * 4) == 9) {
          sVar5 = GetStringViewImpl(this,message,field,scratch);
          return sVar5;
        }
        anon_unknown_6::ReportReflectionUsageTypeError
                  (this->descriptor_,field,"GetStringView",CPPTYPE_STRING);
      }
    }
    else {
      GetStringView();
    }
    pDVar3 = this->descriptor_;
    description = "Field is repeated; the method requires a singular field.";
  }
  else {
    description = "Field does not match message type.";
  }
  anon_unknown_6::ReportReflectionUsageError(pDVar3,field,"GetStringView",description);
}

Assistant:

absl::string_view Reflection::GetStringView(const Message& message,
                                            const FieldDescriptor* field,
                                            ScratchSpace& scratch) const {
  USAGE_CHECK_ALL(GetStringView, SINGULAR, STRING);
  return GetStringViewImpl(message, field, &scratch);
}